

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_filter_by_ext.c
# Opt level: O1

int archive_write_set_format_filter_by_ext(archive *a,char *filename)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = get_array_index(filename);
  if ((int)uVar1 < 0) {
    archive_set_error(a,0x16,"No such format \'%s\'",filename);
    a->state = 0x8000;
    iVar2 = -0x1e;
  }
  else {
    iVar2 = (*names[uVar1].format)(a);
    if (iVar2 == 0) {
      iVar2 = (*names[uVar1].filter)(a);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int
archive_write_set_format_filter_by_ext(struct archive *a, const char *filename)
{
  int names_index = get_array_index(filename);
  
  if (names_index >= 0)
  {  
    int format_state = (names[names_index].format)(a);
    if (format_state == ARCHIVE_OK)
      return ((names[names_index].filter)(a));
    else
      return format_state;
  }    

  archive_set_error(a, EINVAL, "No such format '%s'", filename);
  a->state = ARCHIVE_STATE_FATAL;
  return (ARCHIVE_FATAL);
}